

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O0

string * conv_to_char<char>(char *p)

{
  char *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r;
  char *local_10;
  
  std::__cxx11::string::string(in_RDI);
  local_10 = in_RSI;
  while (*local_10 != '\0') {
    std::__cxx11::string::operator+=(in_RDI,*local_10);
    local_10 = local_10 + 1;
  }
  return in_RDI;
}

Assistant:

std::basic_string<CharType> conv_to_char(char const *p)
{
    std::basic_string<CharType> r;
    while(*p)
        r+=CharType(*p++);
    return r;
}